

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pushOntoSorter(Parse *pParse,SortCtx *pSort,Select *pSelect,int regData,int regOrigData,
                   int nData,int nPrefixReg)

{
  int p2;
  Vdbe *p;
  int iVar1;
  int p1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  KeyInfo *pKVar6;
  int iVar7;
  int p1_00;
  int iVar8;
  char cVar9;
  uint uVar10;
  Op *pOVar11;
  Op *pOVar12;
  int iVar13;
  
  p = pParse->pVdbe;
  uVar10 = pSort->sortFlags & 1;
  p2 = pSort->pOrderBy->nExpr;
  iVar8 = (uVar10 ^ 1) + p2;
  iVar13 = nData + iVar8;
  iVar1 = pParse->nMem;
  iVar5 = iVar1 + 1;
  pParse->nMem = iVar5;
  iVar7 = pSort->nOBSat;
  if (nPrefixReg == 0) {
    iVar1 = iVar1 + 2;
    pParse->nMem = iVar13 + iVar5;
  }
  else {
    iVar1 = regData - iVar8;
  }
  if (pSelect->iOffset == 0) {
    p1 = pSelect->iLimit;
  }
  else {
    p1 = pSelect->iOffset + 1;
  }
  iVar2 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
  pSort->labelDone = iVar2;
  sqlite3ExprCodeExprList
            (pParse,pSort->pOrderBy,iVar1,regOrigData,(regOrigData != 0) * '\x04' + '\x01');
  cVar9 = (char)uVar10;
  if (cVar9 == '\0') {
    sqlite3VdbeAddOp3(p,0x72,pSort->iECursor,iVar1 + p2,0);
  }
  if (0 < nData && nPrefixReg == 0) {
    sqlite3VdbeAddOp3(pParse->pVdbe,0x3f,regData,iVar8 + iVar1,nData);
    sqlite3ExprCacheRemove(pParse,regData,nData);
  }
  sqlite3VdbeAddOp3(p,99,iVar7 + iVar1,iVar13 - iVar7,iVar5);
  if (0 < iVar7) {
    iVar8 = pSort->nOBSat;
    iVar2 = pParse->nMem + 1;
    pParse->nMem = iVar8 + pParse->nMem;
    if (cVar9 == '\0') {
      iVar4 = p2 + iVar1;
      iVar3 = 0x16;
    }
    else {
      iVar4 = pSort->iECursor;
      iVar3 = 0x6e;
    }
    iVar3 = sqlite3VdbeAddOp3(p,iVar3,iVar4,0,0);
    sqlite3VdbeAddOp3(p,0x5e,iVar2,iVar1,pSort->nOBSat);
    iVar4 = pSort->addrSortIndex;
    if (iVar4 < 0) {
      iVar4 = p->nOp + -1;
    }
    if (p->db->mallocFailed == '\0') {
      pOVar11 = p->aOp + iVar4;
    }
    else {
      pOVar11 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    if (pParse->db->mallocFailed != '\0') {
      return;
    }
    pOVar11->p2 = iVar13 - iVar8;
    pKVar6 = (pOVar11->p4).pKeyInfo;
    memset(pKVar6->aSortOrder,0,(ulong)pKVar6->nField);
    sqlite3VdbeChangeP4(p,-1,(char *)pKVar6,-9);
    pKVar6 = keyInfoFromExprList(pParse,pSort->pOrderBy,iVar7,pKVar6->nXField - 1);
    (pOVar11->p4).pKeyInfo = pKVar6;
    iVar8 = p->nOp;
    sqlite3VdbeAddOp3(p,0x12,iVar8 + 1,0,iVar8 + 1);
    iVar4 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
    pSort->labelBkOut = iVar4;
    p1_00 = pParse->nMem + 1;
    pParse->nMem = p1_00;
    pSort->regReturn = p1_00;
    sqlite3VdbeAddOp3(p,0xe,p1_00,iVar4,0);
    sqlite3VdbeAddOp3(p,0x85,pSort->iECursor,0,0);
    if (p1 != 0) {
      sqlite3VdbeAddOp3(p,0x16,p1,pSort->labelDone,0);
    }
    pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
    pOVar11 = (Op *)&sqlite3VdbeGetOp_dummy;
    if (p->db->mallocFailed == '\0') {
      iVar4 = p->nOp + -1;
      if (-1 < iVar3) {
        iVar4 = iVar3;
      }
      pOVar11 = p->aOp + iVar4;
    }
    pOVar11->p2 = p->nOp;
    iVar4 = pSort->nOBSat;
    sqlite3VdbeAddOp3(pParse->pVdbe,0x3f,iVar1,iVar2,iVar4);
    sqlite3ExprCacheRemove(pParse,iVar1,iVar4);
    if (p->db->mallocFailed == '\0') {
      iVar2 = p->nOp + -1;
      if (-1 < iVar8) {
        iVar2 = iVar8;
      }
      pOVar12 = p->aOp + iVar2;
    }
    pOVar12->p2 = p->nOp;
  }
  iVar5 = sqlite3VdbeAddOp3(p,0x7e - (pSort->sortFlags & 1),pSort->iECursor,iVar5,iVar7 + iVar1);
  if (p->db->mallocFailed == '\0') {
    pOVar11 = p->aOp;
    pOVar11[iVar5].p4type = -3;
    pOVar11[iVar5].p4.i = iVar13 - iVar7;
  }
  if (p1 != 0) {
    iVar13 = 0;
    iVar5 = sqlite3VdbeAddOp3(p,0x2f,p1,0,0);
    sqlite3VdbeAddOp3(p,0x21,pSort->iECursor,0,0);
    if (pSort->bOrderedInnerLoop != '\0') {
      iVar13 = pParse->nMem + 1;
      pParse->nMem = iVar13;
      sqlite3VdbeAddOp3(p,0x60,pSort->iECursor,p2,iVar13);
    }
    sqlite3VdbeAddOp3(p,0x76,pSort->iECursor,0,0);
    iVar7 = p->nOp;
    if (pSort->bOrderedInnerLoop != '\0') {
      sqlite3VdbeAddOp3(p,0x4e,iVar1 + p2,iVar7 + 2,iVar13);
      iVar7 = p->nOp;
      if (0 < (long)iVar7) {
        p->aOp[(long)iVar7 + -1].p5 = 0x80;
      }
    }
    if (p->db->mallocFailed == '\0') {
      iVar13 = iVar7 + -1;
      if (-1 < iVar5) {
        iVar13 = iVar5;
      }
      pOVar11 = p->aOp + iVar13;
    }
    else {
      pOVar11 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar11->p2 = iVar7;
  }
  return;
}

Assistant:

static void pushOntoSorter(
  Parse *pParse,         /* Parser context */
  SortCtx *pSort,        /* Information about the ORDER BY clause */
  Select *pSelect,       /* The whole SELECT statement */
  int regData,           /* First register holding data to be sorted */
  int regOrigData,       /* First register holding data before packing */
  int nData,             /* Number of elements in the data array */
  int nPrefixReg         /* No. of reg prior to regData available for use */
){
  Vdbe *v = pParse->pVdbe;                         /* Stmt under construction */
  int bSeq = ((pSort->sortFlags & SORTFLAG_UseSorter)==0);
  int nExpr = pSort->pOrderBy->nExpr;              /* No. of ORDER BY terms */
  int nBase = nExpr + bSeq + nData;                /* Fields in sorter record */
  int regBase;                                     /* Regs for sorter record */
  int regRecord = ++pParse->nMem;                  /* Assembled sorter record */
  int nOBSat = pSort->nOBSat;                      /* ORDER BY terms to skip */
  int op;                            /* Opcode to add sorter record to sorter */
  int iLimit;                        /* LIMIT counter */

  assert( bSeq==0 || bSeq==1 );
  assert( nData==1 || regData==regOrigData || regOrigData==0 );
  if( nPrefixReg ){
    assert( nPrefixReg==nExpr+bSeq );
    regBase = regData - nExpr - bSeq;
  }else{
    regBase = pParse->nMem + 1;
    pParse->nMem += nBase;
  }
  assert( pSelect->iOffset==0 || pSelect->iLimit!=0 );
  iLimit = pSelect->iOffset ? pSelect->iOffset+1 : pSelect->iLimit;
  pSort->labelDone = sqlite3VdbeMakeLabel(v);
  sqlite3ExprCodeExprList(pParse, pSort->pOrderBy, regBase, regOrigData,
                          SQLITE_ECEL_DUP | (regOrigData? SQLITE_ECEL_REF : 0));
  if( bSeq ){
    sqlite3VdbeAddOp2(v, OP_Sequence, pSort->iECursor, regBase+nExpr);
  }
  if( nPrefixReg==0 && nData>0 ){
    sqlite3ExprCodeMove(pParse, regData, regBase+nExpr+bSeq, nData);
  }
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase+nOBSat, nBase-nOBSat, regRecord);
  if( nOBSat>0 ){
    int regPrevKey;   /* The first nOBSat columns of the previous row */
    int addrFirst;    /* Address of the OP_IfNot opcode */
    int addrJmp;      /* Address of the OP_Jump opcode */
    VdbeOp *pOp;      /* Opcode that opens the sorter */
    int nKey;         /* Number of sorting key columns, including OP_Sequence */
    KeyInfo *pKI;     /* Original KeyInfo on the sorter table */

    regPrevKey = pParse->nMem+1;
    pParse->nMem += pSort->nOBSat;
    nKey = nExpr - pSort->nOBSat + bSeq;
    if( bSeq ){
      addrFirst = sqlite3VdbeAddOp1(v, OP_IfNot, regBase+nExpr); 
    }else{
      addrFirst = sqlite3VdbeAddOp1(v, OP_SequenceTest, pSort->iECursor);
    }
    VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_Compare, regPrevKey, regBase, pSort->nOBSat);
    pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
    if( pParse->db->mallocFailed ) return;
    pOp->p2 = nKey + nData;
    pKI = pOp->p4.pKeyInfo;
    memset(pKI->aSortOrder, 0, pKI->nField); /* Makes OP_Jump below testable */
    sqlite3VdbeChangeP4(v, -1, (char*)pKI, P4_KEYINFO);
    testcase( pKI->nXField>2 );
    pOp->p4.pKeyInfo = keyInfoFromExprList(pParse, pSort->pOrderBy, nOBSat,
                                           pKI->nXField-1);
    addrJmp = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeAddOp3(v, OP_Jump, addrJmp+1, 0, addrJmp+1); VdbeCoverage(v);
    pSort->labelBkOut = sqlite3VdbeMakeLabel(v);
    pSort->regReturn = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, pSort->iECursor);
    if( iLimit ){
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, pSort->labelDone);
      VdbeCoverage(v);
    }
    sqlite3VdbeJumpHere(v, addrFirst);
    sqlite3ExprCodeMove(pParse, regBase, regPrevKey, pSort->nOBSat);
    sqlite3VdbeJumpHere(v, addrJmp);
  }
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    op = OP_SorterInsert;
  }else{
    op = OP_IdxInsert;
  }
  sqlite3VdbeAddOp4Int(v, op, pSort->iECursor, regRecord,
                       regBase+nOBSat, nBase-nOBSat);
  if( iLimit ){
    int addr;
    int r1 = 0;
    /* Fill the sorter until it contains LIMIT+OFFSET entries.  (The iLimit
    ** register is initialized with value of LIMIT+OFFSET.)  After the sorter
    ** fills up, delete the least entry in the sorter after each insert.
    ** Thus we never hold more than the LIMIT+OFFSET rows in memory at once */
    addr = sqlite3VdbeAddOp1(v, OP_IfNotZero, iLimit); VdbeCoverage(v);
    sqlite3VdbeAddOp1(v, OP_Last, pSort->iECursor);
    if( pSort->bOrderedInnerLoop ){
      r1 = ++pParse->nMem;
      sqlite3VdbeAddOp3(v, OP_Column, pSort->iECursor, nExpr, r1);
      VdbeComment((v, "seq"));
    }
    sqlite3VdbeAddOp1(v, OP_Delete, pSort->iECursor);
    if( pSort->bOrderedInnerLoop ){
      /* If the inner loop is driven by an index such that values from
      ** the same iteration of the inner loop are in sorted order, then
      ** immediately jump to the next iteration of an inner loop if the
      ** entry from the current iteration does not fit into the top
      ** LIMIT+OFFSET entries of the sorter. */
      int iBrk = sqlite3VdbeCurrentAddr(v) + 2;
      sqlite3VdbeAddOp3(v, OP_Eq, regBase+nExpr, iBrk, r1);
      sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
      VdbeCoverage(v);
    }
    sqlite3VdbeJumpHere(v, addr);
  }
}